

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

QString * uniqueItemName(QString *__return_storage_ptr__,QModelIndex *index)

{
  TreeModel *this;
  qsizetype qVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 subtype;
  QByteArrayView QVar4;
  QString t_2;
  QString subtypeString;
  QString t_3;
  QString t;
  QString itemName;
  QString t_1;
  QString itemText;
  QString local_140;
  QArrayData *local_128;
  char16_t *local_120;
  qsizetype qStack_118;
  QArrayData *local_110;
  char16_t *local_108;
  QAbstractItemModel *pQStack_100;
  QString local_f8;
  QString local_e0;
  QString local_c8;
  QString local_a8;
  QArrayData *local_90;
  char16_t *local_88;
  qsizetype qStack_80;
  QString local_78;
  QString local_60;
  QString local_48;
  
  this = (TreeModel *)index->m;
  if ((index->c | index->r) < 0 || this == (TreeModel *)0x0) {
    QVar4.m_data = (storage_type *)0xc;
    QVar4.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar4);
    (__return_storage_ptr__->d).d = local_c8.d.d;
    (__return_storage_ptr__->d).ptr = local_c8.d.ptr;
    (__return_storage_ptr__->d).size = local_c8.d.size;
    return __return_storage_ptr__;
  }
  TreeModel::name(&local_c8,this,index);
  TreeModel::text(&local_48,this,index);
  (__return_storage_ptr__->d).d = local_c8.d.d;
  (__return_storage_ptr__->d).ptr = local_c8.d.ptr;
  (__return_storage_ptr__->d).size = local_c8.d.size;
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar2 = TreeModel::type(this,index);
  if ((bVar2 - 0x4f < 6) || (bVar2 == 0x42)) {
    if (local_48.d.size == 0) {
      local_110 = &(local_c8.d.d)->super_QArrayData;
      local_108 = local_c8.d.ptr;
      pQStack_100 = (QAbstractItemModel *)local_c8.d.size;
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_e0.d.d = local_c8.d.d;
      local_e0.d.ptr = local_c8.d.ptr;
      local_e0.d.size = local_c8.d.size;
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QChar)(char16_t)&local_e0);
      local_110 = &(local_e0.d.d)->super_QArrayData;
      local_108 = local_e0.d.ptr;
      pQStack_100 = (QAbstractItemModel *)local_e0.d.size;
      if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_110);
    }
    QString::operator=(__return_storage_ptr__,(QString *)&local_110);
    if (local_110 != (QArrayData *)0x0) {
      LOCK();
      (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_110,2,8);
      }
    }
    if (local_48.d.size == 0) goto LAB_00164f92;
  }
  else {
    if (bVar2 != 0x43) goto LAB_00164f92;
    TreeModel::findParentOfType((QModelIndex *)&local_110,this,index,'B');
    TreeModel::text(&local_e0,this,(QModelIndex *)&local_110);
    qVar1 = local_e0.d.size;
    if ((QAbstractItemModel *)local_e0.d.size == (QAbstractItemModel *)0x0) {
      TreeModel::name(&local_140,this,(QModelIndex *)&local_110);
    }
    else {
      TreeModel::name(&local_60,this,(QModelIndex *)&local_110);
      local_90 = &(local_60.d.d)->super_QArrayData;
      local_88 = local_60.d.ptr;
      qStack_80 = local_60.d.size;
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QChar)(char16_t)&local_90);
      local_140.d.d = (Data *)local_90;
      local_140.d.ptr = local_88;
      local_140.d.size = qStack_80;
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_140);
    }
    QString::operator=(__return_storage_ptr__,(QString *)&local_140);
    if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,8);
      }
    }
    if ((QAbstractItemModel *)qVar1 != (QAbstractItemModel *)0x0) {
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,2,8);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
        }
      }
    }
    UVar3 = TreeModel::subtype(this,index);
    if ((UVar3 == '\x02') || (UVar3 = TreeModel::subtype(this,index), UVar3 == '\x18')) {
      TreeModel::name(&local_f8,this,index);
      local_128 = &(local_f8.d.d)->super_QArrayData;
      local_120 = local_f8.d.ptr;
      qStack_118 = local_f8.d.size;
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QChar)(char16_t)&local_128);
      local_140.d.d = (Data *)local_128;
      local_140.d.ptr = local_120;
      local_140.d.size = qStack_118;
      if (local_128 != (QArrayData *)0x0) {
        LOCK();
        (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_128->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_140);
      QString::operator=(__return_storage_ptr__,(QString *)&local_140);
      if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_128 != (QArrayData *)0x0) {
        LOCK();
        (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_128,2,8);
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
        }
      }
    }
  }
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
LAB_00164f92:
  UVar3 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString((QString *)&local_110,UVar3,subtype);
  UVar3 = TreeModel::type(this,index);
  itemTypeToUString(&local_78,UVar3);
  if (pQStack_100 == (QAbstractItemModel *)0x0) {
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
  }
  else {
    QString::QString(&local_a8,(QChar)0x5f);
    QString::append((QString *)&local_a8);
  }
  local_f8.d.d = local_78.d.d;
  local_f8.d.ptr = local_78.d.ptr;
  local_f8.d.size = local_78.d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_f8);
  local_128 = &(local_f8.d.d)->super_QArrayData;
  local_120 = local_f8.d.ptr;
  qStack_118 = local_f8.d.size;
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QChar)(char16_t)&local_128);
  local_140.d.d = (Data *)local_128;
  local_140.d.ptr = local_120;
  local_140.d.size = qStack_118;
  if (local_128 != (QArrayData *)0x0) {
    LOCK();
    (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_128->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_140);
  QString::operator=(__return_storage_ptr__,(QString *)&local_140);
  if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_128 != (QArrayData *)0x0) {
    LOCK();
    (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_128,2,8);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  fixFileName(__return_storage_ptr__,true);
  if (local_110 != (QArrayData *)0x0) {
    LOCK();
    (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_110,2,8);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}